

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O1

string * EncodeBase58Check_abi_cxx11_
                   (string *__return_storage_ptr__,Span<const_unsigned_char> input)

{
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  Span<const_unsigned_char> input_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  uint256 hash;
  uchar *local_c0;
  long local_b8;
  long local_b0;
  uchar local_a8 [32];
  CSHA256 local_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c0,input.m_data,
             input.m_data + input.m_size,(allocator_type *)&local_88);
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_88.buf[0x30] = '\0';
  local_88.buf[0x31] = '\0';
  local_88.buf[0x32] = '\0';
  local_88.buf[0x33] = '\0';
  local_88.buf[0x34] = '\0';
  local_88.buf[0x35] = '\0';
  local_88.buf[0x36] = '\0';
  local_88.buf[0x37] = '\0';
  local_88.buf[0x38] = '\0';
  local_88.buf[0x39] = '\0';
  local_88.buf[0x3a] = '\0';
  local_88.buf[0x3b] = '\0';
  local_88.buf[0x3c] = '\0';
  local_88.buf[0x3d] = '\0';
  local_88.buf[0x3e] = '\0';
  local_88.buf[0x3f] = '\0';
  local_88.buf[0x20] = '\0';
  local_88.buf[0x21] = '\0';
  local_88.buf[0x22] = '\0';
  local_88.buf[0x23] = '\0';
  local_88.buf[0x24] = '\0';
  local_88.buf[0x25] = '\0';
  local_88.buf[0x26] = '\0';
  local_88.buf[0x27] = '\0';
  local_88.buf[0x28] = '\0';
  local_88.buf[0x29] = '\0';
  local_88.buf[0x2a] = '\0';
  local_88.buf[0x2b] = '\0';
  local_88.buf[0x2c] = '\0';
  local_88.buf[0x2d] = '\0';
  local_88.buf[0x2e] = '\0';
  local_88.buf[0x2f] = '\0';
  local_88.buf[0x10] = '\0';
  local_88.buf[0x11] = '\0';
  local_88.buf[0x12] = '\0';
  local_88.buf[0x13] = '\0';
  local_88.buf[0x14] = '\0';
  local_88.buf[0x15] = '\0';
  local_88.buf[0x16] = '\0';
  local_88.buf[0x17] = '\0';
  local_88.buf[0x18] = '\0';
  local_88.buf[0x19] = '\0';
  local_88.buf[0x1a] = '\0';
  local_88.buf[0x1b] = '\0';
  local_88.buf[0x1c] = '\0';
  local_88.buf[0x1d] = '\0';
  local_88.buf[0x1e] = '\0';
  local_88.buf[0x1f] = '\0';
  local_88.buf[0] = '\0';
  local_88.buf[1] = '\0';
  local_88.buf[2] = '\0';
  local_88.buf[3] = '\0';
  local_88.buf[4] = '\0';
  local_88.buf[5] = '\0';
  local_88.buf[6] = '\0';
  local_88.buf[7] = '\0';
  local_88.buf[8] = '\0';
  local_88.buf[9] = '\0';
  local_88.buf[10] = '\0';
  local_88.buf[0xb] = '\0';
  local_88.buf[0xc] = '\0';
  local_88.buf[0xd] = '\0';
  local_88.buf[0xe] = '\0';
  local_88.buf[0xf] = '\0';
  local_88.s[4] = 0;
  local_88.s[5] = 0;
  local_88.s[6] = 0;
  local_88.s[7] = 0;
  local_88.s[0] = 0;
  local_88.s[1] = 0;
  local_88.s[2] = 0;
  local_88.s[3] = 0;
  local_88.bytes = 0;
  CSHA256::CSHA256(&local_88);
  CSHA256::Write(&local_88,local_c0,local_b8 - (long)local_c0);
  output.m_size = 0x20;
  output.m_data = local_a8;
  CHash256::Finalize((CHash256 *)&local_88,output);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c0,local_b8,local_a8,
             local_a8 + 4);
  input_00.m_size = local_b8 - (long)local_c0;
  input_00.m_data = local_c0;
  EncodeBase58_abi_cxx11_(__return_storage_ptr__,input_00);
  if (local_c0 != (uchar *)0x0) {
    operator_delete(local_c0,local_b0 - (long)local_c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeBase58Check(Span<const unsigned char> input)
{
    // add 4-byte hash check to the end
    std::vector<unsigned char> vch(input.begin(), input.end());
    uint256 hash = Hash(vch);
    vch.insert(vch.end(), (unsigned char*)&hash, (unsigned char*)&hash + 4);
    return EncodeBase58(vch);
}